

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O1

void __thiscall Arg::print(Arg *this,ostream *o)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  Functor local_50;
  
  if (this->tag != Register) {
    if (this->tag == Functor) {
      paVar1 = &local_50.id.field_2;
      pcVar3 = (this->f_).id._M_dataplus._M_p;
      local_50.id._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,pcVar3 + (this->f_).id._M_string_length);
      local_50.arity = (this->f_).arity;
      Functor::print(&local_50,o);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.id._M_dataplus._M_p != paVar1) {
        operator_delete(local_50.id._M_dataplus._M_p,local_50.id.field_2._M_allocated_capacity + 1);
      }
    }
    return;
  }
  iVar2 = (this->r_).r;
  std::__ostream_insert<char,std::char_traits<char>>(o,"%",1);
  std::ostream::operator<<((ostream *)o,iVar2);
  return;
}

Assistant:

void print(std::ostream &o) const {
        switch(tag) {
            case ArgTag::Functor: o << f_; return;
            case ArgTag::Register: o << r_; return;
        }

    }